

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uvccapture2.cpp
# Opt level: O2

bool __thiscall V4L2Device::check_capabilities(V4L2Device *this)

{
  int iVar1;
  Writer *pWVar2;
  int *piVar3;
  char *local_f0;
  Writer local_e8;
  v4l2_capability cap;
  
  cap.version = 0;
  cap.capabilities = 0;
  cap.device_caps = 0;
  cap.reserved[0] = 0;
  cap.bus_info[0x10] = '\0';
  cap.bus_info[0x11] = '\0';
  cap.bus_info[0x12] = '\0';
  cap.bus_info[0x13] = '\0';
  cap.bus_info[0x14] = '\0';
  cap.bus_info[0x15] = '\0';
  cap.bus_info[0x16] = '\0';
  cap.bus_info[0x17] = '\0';
  cap.bus_info[0x18] = '\0';
  cap.bus_info[0x19] = '\0';
  cap.bus_info[0x1a] = '\0';
  cap.bus_info[0x1b] = '\0';
  cap.bus_info[0x1c] = '\0';
  cap.bus_info[0x1d] = '\0';
  cap.bus_info[0x1e] = '\0';
  cap.bus_info[0x1f] = '\0';
  cap.bus_info[0] = '\0';
  cap.bus_info[1] = '\0';
  cap.bus_info[2] = '\0';
  cap.bus_info[3] = '\0';
  cap.bus_info[4] = '\0';
  cap.bus_info[5] = '\0';
  cap.bus_info[6] = '\0';
  cap.bus_info[7] = '\0';
  cap.bus_info[8] = '\0';
  cap.bus_info[9] = '\0';
  cap.bus_info[10] = '\0';
  cap.bus_info[0xb] = '\0';
  cap.bus_info[0xc] = '\0';
  cap.bus_info[0xd] = '\0';
  cap.bus_info[0xe] = '\0';
  cap.bus_info[0xf] = '\0';
  cap.card[0x10] = '\0';
  cap.card[0x11] = '\0';
  cap.card[0x12] = '\0';
  cap.card[0x13] = '\0';
  cap.card[0x14] = '\0';
  cap.card[0x15] = '\0';
  cap.card[0x16] = '\0';
  cap.card[0x17] = '\0';
  cap.card[0x18] = '\0';
  cap.card[0x19] = '\0';
  cap.card[0x1a] = '\0';
  cap.card[0x1b] = '\0';
  cap.card[0x1c] = '\0';
  cap.card[0x1d] = '\0';
  cap.card[0x1e] = '\0';
  cap.card[0x1f] = '\0';
  cap.card[0] = '\0';
  cap.card[1] = '\0';
  cap.card[2] = '\0';
  cap.card[3] = '\0';
  cap.card[4] = '\0';
  cap.card[5] = '\0';
  cap.card[6] = '\0';
  cap.card[7] = '\0';
  cap.card[8] = '\0';
  cap.card[9] = '\0';
  cap.card[10] = '\0';
  cap.card[0xb] = '\0';
  cap.card[0xc] = '\0';
  cap.card[0xd] = '\0';
  cap.card[0xe] = '\0';
  cap.card[0xf] = '\0';
  cap.driver[0] = '\0';
  cap.driver[1] = '\0';
  cap.driver[2] = '\0';
  cap.driver[3] = '\0';
  cap.driver[4] = '\0';
  cap.driver[5] = '\0';
  cap.driver[6] = '\0';
  cap.driver[7] = '\0';
  cap.driver[8] = '\0';
  cap.driver[9] = '\0';
  cap.driver[10] = '\0';
  cap.driver[0xb] = '\0';
  cap.driver[0xc] = '\0';
  cap.driver[0xd] = '\0';
  cap.driver[0xe] = '\0';
  cap.driver[0xf] = '\0';
  cap.reserved[1] = 0;
  cap.reserved[2] = 0;
  iVar1 = ioctl(this->fd,0x80685600);
  if (iVar1 < 0) {
    local_e8._vptr_Writer = (_func_int **)&PTR__Writer_00176078;
    local_e8.m_level = Error;
    local_e8.m_file =
         "/workspace/llm4binary/github/license_all_cmakelists_25/thekvs[P]uvccapture2/src/uvccapture2.cpp"
    ;
    local_e8.m_line = 0x131;
    local_e8.m_func = "bool V4L2Device::check_capabilities()";
    local_e8.m_verboseLevel = 0;
    local_e8.m_logger = (Logger *)0x0;
    local_e8.m_proceed = false;
    local_e8.m_messageBuilder.m_logger = (Logger *)0x0;
    local_e8.m_messageBuilder.m_containerLogSeperator = "";
    local_e8.m_dispatchAction = NormalLog;
    local_e8.m_loggerIds.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_e8.m_loggerIds.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_e8.m_loggerIds.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pWVar2 = el::base::Writer::construct(&local_e8,1,"default");
    pWVar2 = el::base::Writer::operator<<(pWVar2,(char (*) [25])"VIDIOC_QUERYCAP failed: ");
    piVar3 = __errno_location();
    local_f0 = strerror(*piVar3);
    el::base::Writer::operator<<(pWVar2,&local_f0);
  }
  else if ((cap._80_8_ & 0x100000000) == 0) {
    local_e8._vptr_Writer = (_func_int **)&PTR__Writer_00176078;
    local_e8.m_level = Error;
    local_e8.m_file =
         "/workspace/llm4binary/github/license_all_cmakelists_25/thekvs[P]uvccapture2/src/uvccapture2.cpp"
    ;
    local_e8.m_line = 0x136;
    local_e8.m_func = "bool V4L2Device::check_capabilities()";
    local_e8.m_verboseLevel = 0;
    local_e8.m_logger = (Logger *)0x0;
    local_e8.m_proceed = false;
    local_e8.m_messageBuilder.m_logger = (Logger *)0x0;
    local_e8.m_messageBuilder.m_containerLogSeperator = "";
    local_e8.m_dispatchAction = NormalLog;
    local_e8.m_loggerIds.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_e8.m_loggerIds.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_e8.m_loggerIds.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pWVar2 = el::base::Writer::construct(&local_e8,1,"default");
    el::base::Writer::operator<<
              (pWVar2,(char (*) [55])"The device does not handle single-planar video capture");
  }
  else {
    if ((cap.capabilities >> 0x1a & 1) != 0) {
      return true;
    }
    local_e8._vptr_Writer = (_func_int **)&PTR__Writer_00176078;
    local_e8.m_level = Error;
    local_e8.m_file =
         "/workspace/llm4binary/github/license_all_cmakelists_25/thekvs[P]uvccapture2/src/uvccapture2.cpp"
    ;
    local_e8.m_line = 0x13b;
    local_e8.m_func = "bool V4L2Device::check_capabilities()";
    local_e8.m_verboseLevel = 0;
    local_e8.m_logger = (Logger *)0x0;
    local_e8.m_proceed = false;
    local_e8.m_messageBuilder.m_logger = (Logger *)0x0;
    local_e8.m_messageBuilder.m_containerLogSeperator = "";
    local_e8.m_dispatchAction = NormalLog;
    local_e8.m_loggerIds.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_e8.m_loggerIds.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_e8.m_loggerIds.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pWVar2 = el::base::Writer::construct(&local_e8,1,"default");
    el::base::Writer::operator<<(pWVar2,(char (*) [43])"The device does not handle frame streaming")
    ;
  }
  el::base::Writer::~Writer(&local_e8);
  return false;
}

Assistant:

bool
    check_capabilities()
    {
        struct v4l2_capability cap;
        std::memset(&cap, 0, sizeof(cap));

        if (ioctl(fd, VIDIOC_QUERYCAP, &cap) < 0) {
            LOG(ERROR) << "VIDIOC_QUERYCAP failed: " << strerror(errno);
            return false;
        }

        if ((cap.capabilities & V4L2_CAP_VIDEO_CAPTURE) == 0) {
            LOG(ERROR) << "The device does not handle single-planar video capture";
            return false;
        }

        if ((cap.capabilities & V4L2_CAP_STREAMING) == 0) {
            LOG(ERROR) << "The device does not handle frame streaming";
            return false;
        }

        return true;
    }